

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(void)

{
  ostream *poVar1;
  
  std::operator<<((ostream *)&std::cout,"Hello ");
  show_color(just::console::impl::color<void>::red);
  show_color(just::console::impl::color<void>::green);
  show_color(just::console::impl::color<void>::blue);
  just::console::reset();
  poVar1 = std::operator<<((ostream *)&std::cout,"World!");
  std::endl<char,std::char_traits<char>>(poVar1);
  return 0;
}

Assistant:

int main()
{
  using just::console::color;

  std::cout << "Hello ";

  show_color(color::red);
  show_color(color::green);
  show_color(color::blue);

  just::console::reset();
  std::cout << "World!" << std::endl;
}